

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  int iVar1;
  Table *pTVar2;
  int *piVar3;
  SrcList_item *pSVar4;
  char *pcVar5;
  _func_int_u32_void_ptr_void_ptr_void_ptr *p_Var6;
  ExprList *pEVar7;
  Select *pSVar8;
  Expr *pEVar9;
  IdList *pIVar10;
  int local_58;
  Table *pTab;
  SrcList_item *pOldItem;
  SrcList_item *pNewItem;
  int nByte;
  int i;
  SrcList *pNew;
  int flags_local;
  SrcList *p_local;
  sqlite3 *db_local;
  
  if (p == (SrcList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    if (p->nSrc < 1) {
      local_58 = 0;
    }
    else {
      local_58 = (p->nSrc + -1) * 0x70;
    }
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)(local_58 + 0x78));
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      iVar1 = p->nSrc;
      *(int *)((long)&db_local->pVfs + 4) = iVar1;
      *(int *)&db_local->pVfs = iVar1;
      for (pNewItem._4_4_ = 0; pNewItem._4_4_ < p->nSrc; pNewItem._4_4_ = pNewItem._4_4_ + 1) {
        piVar3 = db_local->aLimit + (long)pNewItem._4_4_ * 0x1c + -0x1a;
        pSVar4 = p->a + pNewItem._4_4_;
        *(Schema **)piVar3 = pSVar4->pSchema;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zDatabase);
        *(char **)(piVar3 + 2) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zName);
        *(char **)(piVar3 + 4) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zAlias);
        *(char **)(piVar3 + 6) = pcVar5;
        piVar3[0xf] = (int)pSVar4->fg;
        piVar3[0x11] = pSVar4->iCursor;
        piVar3[0xc] = pSVar4->addrFillSub;
        ((sqlite3InitInfo *)(piVar3 + 0xd))->newTnum = pSVar4->regReturn;
        if ((*(byte *)((long)piVar3 + 0x3d) >> 1 & 1) != 0) {
          p_Var6 = (_func_int_u32_void_ptr_void_ptr_void_ptr *)
                   sqlite3DbStrDup(db,(pSVar4->u1).zIndexedBy);
          *(_func_int_u32_void_ptr_void_ptr_void_ptr **)(piVar3 + 0x18) = p_Var6;
        }
        *(Index **)(piVar3 + 0x1a) = pSVar4->pIBIndex;
        if ((*(byte *)((long)piVar3 + 0x3d) >> 2 & 1) != 0) {
          pEVar7 = sqlite3ExprListDup(db,(pSVar4->u1).pFuncArg,flags);
          *(ExprList **)(piVar3 + 0x18) = pEVar7;
        }
        pTVar2 = pSVar4->pTab;
        *(Table **)(piVar3 + 8) = pTVar2;
        if (pTVar2 != (Table *)0x0) {
          pTVar2->nTabRef = pTVar2->nTabRef + 1;
        }
        pSVar8 = sqlite3SelectDup(db,pSVar4->pSelect,flags);
        *(Select **)(piVar3 + 10) = pSVar8;
        pEVar9 = sqlite3ExprDup(db,pSVar4->pOn,flags);
        *(Expr **)(piVar3 + 0x12) = pEVar9;
        pIVar10 = sqlite3IdListDup(db,pSVar4->pUsing);
        *(IdList **)(piVar3 + 0x14) = pIVar10;
        *(void ***)(piVar3 + 0x16) = (void **)pSVar4->colUsed;
      }
    }
  }
  return (SrcList *)db_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    struct SrcList_item *pNewItem = &pNew->a[i];
    struct SrcList_item *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->fg = pOldItem->fg;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }
    pNewItem->pIBIndex = pOldItem->pIBIndex;
    if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg = 
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    pNewItem->pOn = sqlite3ExprDup(db, pOldItem->pOn, flags);
    pNewItem->pUsing = sqlite3IdListDup(db, pOldItem->pUsing);
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}